

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeXMLParser.hpp
# Opt level: O2

void __thiscall xe::xml::Tokenizer::appendTokenStr(Tokenizer *this,string *dst)

{
  size_type sVar1;
  int ndx;
  long lVar2;
  
  sVar1 = dst->_M_string_length;
  std::__cxx11::string::resize((ulong)dst);
  for (lVar2 = 0; lVar2 < this->m_curTokenLen; lVar2 = lVar2 + 1) {
    (dst->_M_dataplus)._M_p[lVar2 + sVar1] =
         (this->m_buf).m_buffer[((this->m_buf).m_back + (int)lVar2) % (this->m_buf).m_size];
  }
  return;
}

Assistant:

inline void Tokenizer::appendTokenStr (std::string& dst) const
{
	DE_ASSERT(m_curToken != TOKEN_INCOMPLETE && m_curToken != TOKEN_END_OF_STRING);

	size_t oldLen = dst.size();
	dst.resize(oldLen+m_curTokenLen);

	for (int ndx = 0; ndx < m_curTokenLen; ndx++)
		dst[oldLen+ndx] = m_buf.peekBack(ndx);
}